

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_ManDivNormalize(Vec_Int_t *vCubeFree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int t_1;
  int t;
  int LitB1;
  int LitA1;
  int LitB0;
  int LitA0;
  int RetValue;
  int *L;
  Vec_Int_t *vCubeFree_local;
  
  piVar4 = Vec_IntArray(vCubeFree);
  iVar1 = Vec_IntSize(vCubeFree);
  if (iVar1 != 4) {
    __assert_fail("Vec_IntSize(vCubeFree) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x232,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  iVar1 = Abc_LitIsCompl(*piVar4);
  iVar2 = Abc_LitIsCompl(piVar4[1]);
  if ((iVar1 == iVar2) || (*piVar4 >> 2 != piVar4[1] >> 2)) {
    iVar1 = Abc_LitIsCompl(piVar4[1]);
    iVar2 = Abc_LitIsCompl(piVar4[2]);
    if ((iVar1 == iVar2) || (piVar4[1] >> 2 != piVar4[2] >> 2)) {
      iVar1 = Abc_LitIsCompl(piVar4[2]);
      iVar2 = Abc_LitIsCompl(piVar4[3]);
      if ((iVar1 == iVar2) || (piVar4[2] >> 2 != piVar4[3] >> 2)) {
        return -1;
      }
      iVar1 = Abc_LitIsCompl(*piVar4);
      iVar2 = Abc_LitIsCompl(piVar4[1]);
      if (iVar1 == iVar2) {
        return -1;
      }
      LitA1 = Abc_Lit2Var(piVar4[2]);
      LitB1 = Abc_Lit2Var(piVar4[3]);
      iVar1 = Abc_LitIsCompl(piVar4[2]);
      iVar2 = Abc_LitIsCompl(*piVar4);
      if (iVar1 == iVar2) {
        t = Abc_Lit2Var(*piVar4);
        t_1 = Abc_Lit2Var(piVar4[1]);
      }
      else {
        t = Abc_Lit2Var(piVar4[1]);
        t_1 = Abc_Lit2Var(*piVar4);
      }
    }
    else {
      iVar1 = Abc_LitIsCompl(*piVar4);
      iVar2 = Abc_LitIsCompl(piVar4[3]);
      if (iVar1 == iVar2) {
        return -1;
      }
      LitA1 = Abc_Lit2Var(piVar4[1]);
      LitB1 = Abc_Lit2Var(piVar4[2]);
      iVar1 = Abc_LitIsCompl(piVar4[1]);
      iVar2 = Abc_LitIsCompl(*piVar4);
      if (iVar1 == iVar2) {
        t = Abc_Lit2Var(*piVar4);
        t_1 = Abc_Lit2Var(piVar4[3]);
      }
      else {
        t = Abc_Lit2Var(piVar4[3]);
        t_1 = Abc_Lit2Var(*piVar4);
      }
    }
  }
  else {
    iVar1 = Abc_LitIsCompl(piVar4[2]);
    iVar2 = Abc_LitIsCompl(piVar4[3]);
    if (iVar1 == iVar2) {
      return -1;
    }
    LitA1 = Abc_Lit2Var(*piVar4);
    LitB1 = Abc_Lit2Var(piVar4[1]);
    iVar1 = Abc_LitIsCompl(*piVar4);
    iVar2 = Abc_LitIsCompl(piVar4[2]);
    if (iVar1 == iVar2) {
      iVar1 = Abc_LitIsCompl(piVar4[1]);
      iVar2 = Abc_LitIsCompl(piVar4[3]);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0x23a,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
      t = Abc_Lit2Var(piVar4[2]);
      t_1 = Abc_Lit2Var(piVar4[3]);
    }
    else {
      iVar1 = Abc_LitIsCompl(*piVar4);
      iVar2 = Abc_LitIsCompl(piVar4[3]);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0x23f,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
      iVar1 = Abc_LitIsCompl(piVar4[1]);
      iVar2 = Abc_LitIsCompl(piVar4[2]);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0x240,"int Fx_ManDivNormalize(Vec_Int_t *)");
      }
      t = Abc_Lit2Var(piVar4[3]);
      t_1 = Abc_Lit2Var(piVar4[2]);
    }
  }
  iVar2 = LitA1;
  iVar1 = t;
  iVar3 = Abc_LitNot(LitB1);
  if (LitA1 != iVar3) {
    __assert_fail("LitA0 == Abc_LitNot(LitB0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x25a,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  iVar3 = Abc_LitIsCompl(LitA1);
  if (iVar3 != 0) {
    LitA1 = LitB1;
    LitB1 = iVar2;
    t = t_1;
    t_1 = iVar1;
  }
  iVar1 = Abc_LitIsCompl(LitA1);
  if (iVar1 == 0) {
    iVar1 = Abc_LitIsCompl(t);
    if (iVar1 != 0) {
      t = Abc_LitNot(t);
      t_1 = Abc_LitNot(t_1);
    }
    LitB0 = (int)(iVar1 != 0);
    iVar1 = Abc_LitIsCompl(t);
    if (iVar1 == 0) {
      iVar1 = Abc_Var2Lit(LitA1,0);
      *piVar4 = iVar1;
      iVar1 = Abc_Var2Lit(LitB1,1);
      piVar4[1] = iVar1;
      iVar1 = Abc_Var2Lit(t,0);
      piVar4[2] = iVar1;
      iVar1 = Abc_Var2Lit(t_1,1);
      piVar4[3] = iVar1;
      return LitB0;
    }
    __assert_fail("!Abc_LitIsCompl(LitA1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x267,"int Fx_ManDivNormalize(Vec_Int_t *)");
  }
  __assert_fail("!Abc_LitIsCompl(LitA0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                ,0x260,"int Fx_ManDivNormalize(Vec_Int_t *)");
}

Assistant:

static int Fx_ManDivNormalize( Vec_Int_t * vCubeFree ) // return 1 if complemented
{
    int * L = Vec_IntArray(vCubeFree);
    int RetValue = 0, LitA0 = -1, LitB0 = -1, LitA1 = -1, LitB1 = -1;
    assert( Vec_IntSize(vCubeFree) == 4 );
    if ( Abc_LitIsCompl(L[0]) != Abc_LitIsCompl(L[1]) && (L[0] >> 2) == (L[1] >> 2) ) // diff cubes, same vars
    {
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[0]), LitB0 = Abc_Lit2Var(L[1]);
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[2]) )
        {
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3]) );
            LitA1 = Abc_Lit2Var(L[2]), LitB1 = Abc_Lit2Var(L[3]);
        }
        else
        {
            assert( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) );
            assert( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2]) );
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[2]);
        }
    }
    else if ( Abc_LitIsCompl(L[1]) != Abc_LitIsCompl(L[2]) && (L[1] >> 2) == (L[2] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[1]), LitB0 = Abc_Lit2Var(L[2]);
        if ( Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[3]);
        else
            LitA1 = Abc_Lit2Var(L[3]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else if ( Abc_LitIsCompl(L[2]) != Abc_LitIsCompl(L[3]) && (L[2] >> 2) == (L[3] >> 2) )
    {
        if ( Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[1]) )
            return -1;
        LitA0 = Abc_Lit2Var(L[2]), LitB0 = Abc_Lit2Var(L[3]);
        if ( Abc_LitIsCompl(L[2]) == Abc_LitIsCompl(L[0]) )
            LitA1 = Abc_Lit2Var(L[0]), LitB1 = Abc_Lit2Var(L[1]);
        else
            LitA1 = Abc_Lit2Var(L[1]), LitB1 = Abc_Lit2Var(L[0]);
    }
    else 
        return -1;
    assert( LitA0 == Abc_LitNot(LitB0) );
    if ( Abc_LitIsCompl(LitA0) )
    {
        ABC_SWAP( int, LitA0, LitB0 );
        ABC_SWAP( int, LitA1, LitB1 );
    }
    assert( !Abc_LitIsCompl(LitA0) );
    if ( Abc_LitIsCompl(LitA1) )
    {
        LitA1 = Abc_LitNot(LitA1);
        LitB1 = Abc_LitNot(LitB1);
        RetValue = 1;
    }
    assert( !Abc_LitIsCompl(LitA1) );
    // arrange literals in such as a way that
    // - the first two literals are control literals from different cubes
    // - the third literal is non-complented data input
    // - the forth literal is possibly complemented data input
    L[0] = Abc_Var2Lit( LitA0, 0 );
    L[1] = Abc_Var2Lit( LitB0, 1 );
    L[2] = Abc_Var2Lit( LitA1, 0 );
    L[3] = Abc_Var2Lit( LitB1, 1 );
    return RetValue;
}